

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::TrackValueInfoChangeForKills
          (GlobOpt *this,BasicBlock *block,Value *value,ValueInfo *newValueInfo,bool compensated)

{
  ValueType *pVVar1;
  ValueInfo *valueInfo;
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  ArrayValueInfo *pAVar6;
  bool bVar7;
  Value *local_38;
  Value *value_local;
  
  local_38 = value;
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f4,"(block)","block");
    if (!bVar3) goto LAB_0043dcdc;
    *puVar5 = 0;
  }
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f5,"(value)","value");
    if (!bVar3) goto LAB_0043dcdc;
    *puVar5 = 0;
  }
  if (newValueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f6,"(newValueInfo)","newValueInfo");
    if (!bVar3) goto LAB_0043dcdc;
    *puVar5 = 0;
  }
  valueInfo = value->valueInfo;
  pVVar1 = &valueInfo->super_ValueType;
  bVar3 = ValueType::IsAnyOptimizedArray(pVVar1);
  if (bVar3) {
    bVar3 = ValueType::IsArrayOrObjectWithArray(pVVar1);
    VerifyArrayValueInfoForTracking(this,valueInfo,bVar3,block,compensated);
  }
  bVar4 = ValueType::IsArrayOrObjectWithArray(pVVar1);
  bVar3 = true;
  if (!bVar4) {
    bVar4 = ValueType::IsOptimizedVirtualTypedArray(pVVar1);
    if (!bVar4) {
      bVar4 = ValueType::IsOptimizedTypedArray(pVVar1);
      bVar3 = false;
      if (bVar4) {
        bVar4 = ValueInfo::IsArrayValueInfo(valueInfo);
        if (bVar4) {
          pAVar6 = ValueInfo::AsArrayValueInfo(valueInfo);
          bVar3 = pAVar6->headSegmentLengthSym != (StackSym *)0x0;
        }
      }
    }
  }
  bVar4 = JsUtil::
          BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&((block->globOptData).valuesToKillOnCalls)->
                         super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        ,&local_38);
  if (bVar3 != bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3309,
                       "(trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value))"
                       ,
                       "trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value)"
                      );
    if (!bVar4) {
LAB_0043dcdc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pVVar1 = &newValueInfo->super_ValueType;
  bVar4 = ValueType::IsAnyOptimizedArray(pVVar1);
  if (bVar4) {
    bVar4 = ValueType::IsArrayOrObjectWithArray(pVVar1);
    VerifyArrayValueInfoForTracking(this,newValueInfo,bVar4,block,compensated);
  }
  bVar4 = ValueType::IsArrayOrObjectWithArray(pVVar1);
  bVar7 = true;
  if (!bVar4) {
    bVar4 = ValueType::IsOptimizedVirtualTypedArray(pVVar1);
    if (!bVar4) {
      bVar4 = ValueType::IsOptimizedTypedArray(pVVar1);
      if (bVar4) {
        bVar4 = ValueInfo::IsArrayValueInfo(newValueInfo);
        if (bVar4) {
          pAVar6 = ValueInfo::AsArrayValueInfo(newValueInfo);
          bVar7 = pAVar6->headSegmentLengthSym != (StackSym *)0x0;
          goto LAB_0043dca8;
        }
      }
      bVar7 = false;
    }
  }
LAB_0043dca8:
  if (bVar3 != bVar7) {
    this_00 = (block->globOptData).valuesToKillOnCalls;
    if (bVar7 == false) {
      JsUtil::
      BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Remove(this_00,&local_38);
    }
    else {
      JsUtil::
      BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Add(this_00,&local_38);
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackValueInfoChangeForKills(BasicBlock *const block, Value *const value, ValueInfo *const newValueInfo, const bool compensated) const
{
    Assert(block);
    Assert(value);
    Assert(newValueInfo);

    ValueInfo *const oldValueInfo = value->GetValueInfo();

#if DBG
    if(oldValueInfo->IsAnyOptimizedArray())
    {
        VerifyArrayValueInfoForTracking(oldValueInfo, oldValueInfo->IsArrayOrObjectWithArray(), block, compensated);
    }
#endif

    const bool trackOldValueInfo =
        oldValueInfo->IsArrayOrObjectWithArray() ||
        oldValueInfo->IsOptimizedVirtualTypedArray() ||
        (
            oldValueInfo->IsOptimizedTypedArray() &&
            oldValueInfo->IsArrayValueInfo() &&
            oldValueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()
        );
    Assert(trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value));

#if DBG
    if(newValueInfo->IsAnyOptimizedArray())
    {
        VerifyArrayValueInfoForTracking(newValueInfo, newValueInfo->IsArrayOrObjectWithArray(), block, compensated);
    }
#endif

    const bool trackNewValueInfo =
        newValueInfo->IsArrayOrObjectWithArray() ||
        newValueInfo->IsOptimizedVirtualTypedArray() ||
        (
            newValueInfo->IsOptimizedTypedArray() &&
            newValueInfo->IsArrayValueInfo() &&
            newValueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()
        );

    if(trackOldValueInfo == trackNewValueInfo)
    {
        return;
    }

    if(trackNewValueInfo)
    {
        block->globOptData.valuesToKillOnCalls->Add(value);
    }
    else
    {
        block->globOptData.valuesToKillOnCalls->Remove(value);
    }
}